

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFeeder.cpp
# Opt level: O2

void __thiscall chrono::ChFeeder::ChFeeder(ChFeeder *this,ChFeeder *other)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ChVector<double> local_58;
  ChQuaternion<double> local_38;
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChFeeder_0115cb40;
  (this->feeder).super___shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->feeder).super___shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_38.m_data[0] = 1.0;
  local_58.m_data[2] = 0.0;
  local_38.m_data[3] = 0.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 0.0;
  local_38.m_data[1] = 0.0;
  local_38.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->reference,&local_58,&local_38);
  std::__shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->feeder).super___shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>,
             &(other->feeder).super___shared_ptr<chrono::ChContactable,_(__gnu_cxx::_Lock_policy)2>)
  ;
  ChFrame<double>::operator=(&this->reference,&other->reference);
  dVar1 = other->v_y;
  dVar2 = other->v_z;
  dVar3 = other->w_x;
  this->v_x = other->v_x;
  this->v_y = dVar1;
  this->v_z = dVar2;
  this->w_x = dVar3;
  dVar1 = other->w_z;
  this->w_y = other->w_y;
  this->w_z = dVar1;
  return;
}

Assistant:

ChFeeder::ChFeeder(const ChFeeder& other) : ChPhysicsItem(other) {
    feeder  = other.feeder;
    reference = other.reference;
    v_x = other.v_x;
    v_y = other.v_y;
    v_z = other.v_z;
    w_x = other.w_x;
    w_y = other.w_y;
    w_z = other.w_z;
}